

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Options::ReporterOptionParser::parseIntoConfig
          (ReporterOptionParser *this,Command *cmd,ConfigData *config)

{
  pointer pbVar1;
  pointer pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pbVar1 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + pbVar1->_M_string_length);
  std::__cxx11::string::operator=((string *)config,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                config.reporter = cmd[0];
            }